

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void determine_input_device(void)

{
  int iVar1;
  istream *piVar2;
  long lVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  results;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  stringstream input_dev_path;
  ostream local_330 [376];
  stringstream output;
  
  setegid(0xfffe);
  seteuid(0xfffe);
  execute_abi_cxx11_((string *)&input_dev_path,
                     "/bin/grep -E \'Handlers|EV=\' /proc/bus/input/devices | /bin/grep -B1 \'EV=1[02]001[3Ff]\' | /bin/grep -Eo \'event[0-9]+\' "
                    );
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&output,(string *)&input_dev_path,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&input_dev_path);
  results.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  results.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&output,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    lVar3 = std::__cxx11::string::find((char *)&line,0x1088f0);
    uVar4 = lVar3 + 5;
    if (lVar3 == -1) {
      uVar4 = 0xffffffffffffffff;
    }
    if (uVar4 < line._M_string_length) {
      iVar1 = atoi(line._M_dataplus._M_p + uVar4);
      if (iVar1 != -1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&input_dev_path);
        std::operator<<(local_330,"/dev/input/");
        std::operator<<(local_330,"event");
        std::ostream::operator<<(local_330,iVar1);
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&results,
                   &local_360);
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::stringstream::~stringstream((stringstream *)&input_dev_path);
      }
    }
  }
  if (results.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      results.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    error(0,0,"Couldn\'t determine keyboard device. :/");
    error(1,0,
          "Please post contents of your /proc/bus/input/devices file as a new bug report. Thanks!");
  }
  std::__cxx11::string::_M_assign((string *)&args.device);
  seteuid(0);
  setegid(0);
  std::__cxx11::string::~string((string *)&line);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&results);
  std::__cxx11::stringstream::~stringstream((stringstream *)&output);
  return;
}

Assistant:

void determine_input_device()
{
    // better be safe than sory: while running other programs, switch user to nobody
    setegid(65534); seteuid(65534);

    // extract input number from /proc/bus/input/devices (I don't know how to do it better. If you have an idea, please let me know.)
    // The compiler automatically concatenates these adjacent strings to a single string.
    const char* cmd = EXE_GREP " -E 'Handlers|EV=' /proc/bus/input/devices | "
                      EXE_GREP " -B1 'EV=1[02]001[3Ff]' | "
                      EXE_GREP " -Eo 'event[0-9]+' ";
    std::stringstream output(execute(cmd));

    std::vector<std::string> results;
    std::string line;

    while(std::getline(output, line)) {
        std::string::size_type i = line.find("event");
        if (i != std::string::npos) i += 5;                         // "event".size() == 5
        if (i < line.size()) {
            int index = atoi(&line.c_str()[i]);

            if (index != -1) {
                std::stringstream input_dev_path;
                input_dev_path << INPUT_EVENT_PATH;
                input_dev_path << "event";
                input_dev_path << index;

                results.push_back(input_dev_path.str());
            }
        }
    }

    if (results.size() == 0) {
        error(0, 0, "Couldn't determine keyboard device. :/");
        error(EXIT_FAILURE, 0, "Please post contents of your /proc/bus/input/devices file as a new bug report. Thanks!");
    }

    args.device = results[0];             // for now, use only the first found device

    // now we reclaim those root privileges
    seteuid(0); setegid(0);
}